

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall file_hash_8::test_method(file_hash_8 *this)

{
  uchar uVar1;
  unit_test_log_t *puVar2;
  const_string local_118;
  const_string local_108;
  const_string local_f8;
  const_string local_e8;
  const_string local_d8;
  const_string local_c8;
  const_string local_b8;
  const_string local_a8;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  unit_test_log_t local_58;
  undefined1 local_50;
  undefined1 *local_48;
  char *local_40;
  undefined4 local_38;
  uchar local_31;
  
  local_118.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_118.m_end = "";
  local_108.m_begin = "";
  local_108.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,&local_118,0x37,&local_108);
  local_50 = 0;
  local_58.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001cf9a0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = "";
  local_98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_90 = "";
  local_31 = assert_hash::file_hash<unsigned_char>("");
  local_38 = 0;
  puVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (puVar2,&local_98,0x37,1,2,&local_31,"ah::file_hash< std::uint8_t >( \"\" )",&local_38,
             "0");
  local_f8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_f8.m_end = "";
  local_e8.m_begin = "";
  local_e8.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,&local_f8,0x38,&local_e8);
  local_50 = 0;
  local_58.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001cf9a0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = "";
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_80 = "";
  uVar1 = assert_hash::file_hash<unsigned_char>("a");
  local_38 = CONCAT31(local_38._1_3_,uVar1);
  local_31 = 'a';
  puVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,char>
            (puVar2,&local_88,0x38,1,2,&local_38,"ah::file_hash< std::uint8_t >( \"a\" )",&local_31,
             "\'a\'");
  local_d8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_d8.m_end = "";
  local_c8.m_begin = "";
  local_c8.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,&local_d8,0x39,&local_c8);
  local_50 = 0;
  local_58.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001cf9a0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = "";
  local_78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_70 = "";
  local_31 = assert_hash::file_hash<unsigned_char>("ab");
  local_38 = 0xc3;
  puVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (puVar2,&local_78,0x39,1,2,&local_31,"ah::file_hash< std::uint8_t >( \"ab\" )",&local_38
             ,"\'a\' + \'b\'");
  local_b8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_b8.m_end = "";
  local_a8.m_begin = "";
  local_a8.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,&local_b8,0x3a,&local_a8);
  local_50 = 0;
  local_58.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001cf9a0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = "";
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_60 = "";
  local_31 = assert_hash::file_hash<unsigned_char>("abc");
  local_38 = 0x26;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (&local_58,&local_68,0x3a,1,2,&local_31,"ah::file_hash< std::uint8_t >( \"abc\" )",
             &local_38,"( \'a\' + \'b\' + \'c\' ) & 0xff");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( file_hash_8 )
{
    BOOST_CHECK_EQUAL( ah::file_hash< std::uint8_t >( "" ), 0 );
    BOOST_CHECK_EQUAL( ah::file_hash< std::uint8_t >( "a" ), 'a' );
    BOOST_CHECK_EQUAL( ah::file_hash< std::uint8_t >( "ab" ), 'a' + 'b' );
    BOOST_CHECK_EQUAL( ah::file_hash< std::uint8_t >( "abc" ), ( 'a' + 'b' + 'c' ) & 0xff );
}